

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2pointutil.cc
# Opt level: O0

void S2::GetFrame(S2Point *z,Matrix3x3_d *m)

{
  Matrix3x3_d *pMVar1;
  bool bVar2;
  ostream *poVar3;
  MVector local_90;
  Vector3<double> local_78;
  S2Point local_60;
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  Matrix3x3_d *local_18;
  Matrix3x3_d *m_local;
  S2Point *z_local;
  
  local_18 = m;
  m_local = (Matrix3x3_d *)z;
  bVar2 = IsUnitLength(z);
  local_31 = 0;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2pointutil.cc"
               ,0x67,kFatal,(ostream *)&std::cerr);
    local_31 = 1;
    poVar3 = S2LogMessage::stream(&local_30);
    poVar3 = std::operator<<(poVar3,"Check failed: IsUnitLength(z) ");
    S2LogMessageVoidify::operator&(&local_19,poVar3);
  }
  if ((local_31 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  Matrix3x3<double>::SetCol(local_18,2,(MVector *)m_local);
  pMVar1 = local_18;
  Ortho(&local_60,(S2Point *)m_local);
  Matrix3x3<double>::SetCol(pMVar1,1,&local_60);
  pMVar1 = local_18;
  Matrix3x3<double>::Col(&local_90,local_18,1);
  Vector3<double>::CrossProd(&local_78,&local_90,(Vector3<double> *)m_local);
  Matrix3x3<double>::SetCol(pMVar1,0,&local_78);
  return;
}

Assistant:

void GetFrame(const S2Point& z, Matrix3x3_d* m) {
  S2_DCHECK(IsUnitLength(z));
  m->SetCol(2, z);
  m->SetCol(1, Ortho(z));
  m->SetCol(0, m->Col(1).CrossProd(z));  // Already unit-length.
}